

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O0

Vec2f __thiscall embree::XML::parm_Vec2f(XML *this,string *parmID)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer ppVar2;
  Vec2f VVar3;
  const_iterator i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string local_d8 [24];
  string *in_stack_ffffffffffffff40;
  ParseLocation *in_stack_ffffffffffffffa8;
  string local_48 [32];
  _Self local_28;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffef8,(key_type *)0x3c14fa);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffef8);
  bVar1 = std::operator==(local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x3c168e);
    std::__cxx11::string::string(local_d8,(string *)&ppVar2->second);
    string_to_Vec2f(in_stack_ffffffffffffff40);
    VVar3.field_0 =
         (anon_union_8_2_4062524c_for_Vec2<float>_1)std::__cxx11::string::~string(local_d8);
    return (Vec2f)VVar3.field_0;
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffffa8);
  std::operator+(__lhs,(char *)in_stack_ffffffffffffff00);
  std::operator+(__lhs,in_stack_ffffffffffffff00);
  std::operator+(__lhs,(char *)in_stack_ffffffffffffff00);
  std::runtime_error::runtime_error((runtime_error *)__lhs,local_48);
  __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec2f parm_Vec2f(const std::string& parmID) const {
      std::map<std::string,std::string>::const_iterator i = parms.find(parmID);
      if (i == parms.end()) THROW_RUNTIME_ERROR (loc.str()+": XML node has no parameter \"" + parmID + "\"");
      return string_to_Vec2f(i->second);
    }